

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.h
# Opt level: O2

void __thiscall
HighsGFkSolve::fromCSC<2u,1,long>
          (HighsGFkSolve *this,vector<long,_std::allocator<long>_> *Aval,
          vector<int,_std::allocator<int>_> *Aindex,vector<int,_std::allocator<int>_> *Astart,
          HighsInt numRow)

{
  pointer puVar1;
  HighsGFkSolve *this_00;
  int iVar2;
  pointer piVar3;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  HighsInt pos;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  size_type sVar8;
  uint local_74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  _Vector_base<int,_std::allocator<int>_> local_68;
  HighsGFkSolve *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  puVar1 = (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  piVar3 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  local_70 = &this->Avalue;
  piVar3 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = Aindex;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&(this->freeslots).c,&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  iVar2 = (int)((ulong)((long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2) + -1;
  this->numCol = iVar2;
  this->numRow = numRow;
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->colhead,(long)iVar2,(value_type_conflict2 *)&local_68);
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->colsize,(long)this->numCol,(value_type_conflict2 *)&local_68);
  sVar8 = (size_type)numRow;
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->rhs,sVar8,(value_type_conflict3 *)&local_68);
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->rowroot,sVar8,(value_type_conflict2 *)&local_68);
  local_68._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_68._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->rowsize,sVar8,(value_type_conflict2 *)&local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_70,(long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->Acol,
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->Arow,
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_40 = this;
  for (iVar2 = 0; this_00 = local_40,
      local_68._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_68._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2),
      iVar2 != local_40->numCol; iVar2 = iVar2 + 1) {
    piVar3 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar5 = (ulong)piVar3[iVar2];
    lVar7 = uVar5 << 2;
    for (; (int)uVar5 != piVar3[(long)iVar2 + 1]; uVar5 = (ulong)((int)uVar5 + 1)) {
      if ((*(byte *)((long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar7 * 2) & 1) != 0) {
        local_74 = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_70,&local_74);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->Acol,(value_type_conflict2 *)&local_68);
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->Arow,
                   (value_type_conflict2 *)
                   ((long)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar7));
        piVar3 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = (int)local_68._M_impl.super__Vector_impl_data._M_start;
      }
      lVar7 = lVar7 + 4;
    }
  }
  uVar6 = (uint)((ulong)((long)(local_40->Avalue).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_40->Avalue).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  sVar8 = (size_type)(int)uVar6;
  std::vector<int,_std::allocator<int>_>::resize(&local_40->Anext,sVar8);
  std::vector<int,_std::allocator<int>_>::resize(&this_00->Aprev,sVar8);
  std::vector<int,_std::allocator<int>_>::resize(&this_00->ARleft,sVar8);
  std::vector<int,_std::allocator<int>_>::resize(&this_00->ARright,sVar8);
  __to = extraout_RDX;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    link(this_00,(char *)(ulong)uVar4,__to);
    __to = extraout_RDX_00;
  }
  return;
}

Assistant:

void fromCSC(const std::vector<T>& Aval, const std::vector<HighsInt>& Aindex,
               const std::vector<HighsInt>& Astart, HighsInt numRow) {
    Avalue.clear();
    Acol.clear();
    Arow.clear();

    freeslots = decltype(freeslots)();

    numCol = Astart.size() - 1;
    this->numRow = numRow;

    colhead.assign(numCol, -1);
    colsize.assign(numCol, 0);

    rhs.assign(kNumRhs * numRow, 0);
    rowroot.assign(numRow, -1);
    rowsize.assign(numRow, 0);

    Avalue.reserve(Aval.size());
    Acol.reserve(Aval.size());
    Arow.reserve(Aval.size());

    for (HighsInt i = 0; i != numCol; ++i) {
      for (HighsInt j = Astart[i]; j != Astart[i + 1]; ++j) {
        assert(Aval[j] == (int64_t)Aval[j]);
        int64_t val = ((int64_t)Aval[j]) % k;
        if (val == 0) continue;

        if (val < 0) val += k;
        assert(val >= 0);

        Avalue.push_back(val);
        Acol.push_back(i);
        Arow.push_back(Aindex[j]);
      }
    }

    HighsInt nnz = Avalue.size();
    Anext.resize(nnz);
    Aprev.resize(nnz);
    ARleft.resize(nnz);
    ARright.resize(nnz);
    for (HighsInt pos = 0; pos != nnz; ++pos) link(pos);
  }